

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

fy_diag_cfg * fy_diag_cfg_from_document(fy_diag_cfg *cfg,fy_document *fyd)

{
  _Bool _Var1;
  fy_parse_cfg_flags pflags;
  FILE *pFVar2;
  fy_document *fyd_local;
  fy_diag_cfg *cfg_local;
  
  if ((cfg == (fy_diag_cfg *)0x0) || (fyd == (fy_document *)0x0)) {
    cfg_local = (fy_diag_cfg *)0x0;
  }
  else {
    fy_diag_cfg_default(cfg);
    pFVar2 = fy_document_get_error_fp(fyd);
    cfg->fp = pFVar2;
    pflags = fy_document_get_cfg_flags(fyd);
    fy_diag_cfg_from_parser_flags(cfg,pflags);
    _Var1 = fy_document_is_colorized(fyd);
    cfg->field_0x20 = cfg->field_0x20 & 0xfe | _Var1;
    cfg_local = cfg;
  }
  return cfg_local;
}

Assistant:

struct fy_diag_cfg *fy_diag_cfg_from_document(struct fy_diag_cfg *cfg, struct fy_document *fyd) {
    if (!cfg || !fyd)
        return NULL;

    fy_diag_cfg_default(cfg);
    cfg->fp = fy_document_get_error_fp(fyd);
    fy_diag_cfg_from_parser_flags(cfg, fy_document_get_cfg_flags(fyd));
    cfg->colorize = fy_document_is_colorized(fyd);

    return cfg;
}